

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O0

int writeTime(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json)

{
  int iVar1;
  long lVar2;
  curl_off_t secs;
  curl_off_t us;
  _Bool valid;
  _Bool use_json_local;
  per_transfer *ppStack_20;
  CURLcode per_result_local;
  per_transfer *per_local;
  writeoutvar *wovar_local;
  FILE *stream_local;
  
  us._2_1_ = 0;
  secs = 0;
  us._3_1_ = use_json;
  us._4_4_ = per_result;
  ppStack_20 = per;
  per_local = (per_transfer *)wovar;
  wovar_local = (writeoutvar *)stream;
  if ((wovar->ci != CURLINFO_NONE) &&
     (iVar1 = curl_easy_getinfo(per->curl,wovar->ci,&secs), iVar1 == 0)) {
    us._2_1_ = 1;
  }
  if ((us._2_1_ & 1) == 0) {
    if ((us._3_1_ & 1) != 0) {
      curl_mfprintf(wovar_local,"\"%s\":null",per_local->next);
    }
  }
  else {
    lVar2 = secs / 1000000;
    secs = secs % 1000000;
    if ((us._3_1_ & 1) != 0) {
      curl_mfprintf(wovar_local,"\"%s\":",per_local->next);
    }
    curl_mfprintf(wovar_local,"%lu.%06lu",lVar2,secs);
  }
  return 1;
}

Assistant:

static int writeTime(FILE *stream, const struct writeoutvar *wovar,
                     struct per_transfer *per, CURLcode per_result,
                     bool use_json)
{
  bool valid = false;
  curl_off_t us = 0;

  (void)per;
  (void)per_result;
  DEBUGASSERT(wovar->writefunc == writeTime);

  if(wovar->ci) {
    if(!curl_easy_getinfo(per->curl, wovar->ci, &us))
      valid = true;
  }
  else {
    DEBUGASSERT(0);
  }

  if(valid) {
    curl_off_t secs = us / 1000000;
    us %= 1000000;

    if(use_json)
      fprintf(stream, "\"%s\":", wovar->name);

    fprintf(stream, "%" CURL_FORMAT_CURL_OFF_TU
            ".%06" CURL_FORMAT_CURL_OFF_TU, secs, us);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }

  return 1; /* return 1 if anything was written */
}